

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

MinBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_minbroadcastable
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  MinBroadcastableLayerParams *pMVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x366) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x366;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pMVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::MinBroadcastableLayerParams>(arena);
    (this->layer_).minbroadcastable_ = pMVar2;
  }
  return (MinBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MinBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_minbroadcastable() {
  if (!_internal_has_minbroadcastable()) {
    clear_layer();
    set_has_minbroadcastable();
    layer_.minbroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::MinBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.minbroadcastable_;
}